

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banner.cpp
# Opt level: O2

bool MakeBanner(path *specfile_path,path *outfile_path)

{
  char cVar1;
  path local_da0;
  SpecFileData specfile_data;
  IconBitmap local_c70;
  ofstream ostream;
  undefined1 local_870 [552];
  size_type sStack_648;
  size_type local_640;
  uchar auStack_638 [8];
  unsigned_short local_630 [128];
  unsigned_short local_530 [128];
  unsigned_short local_430 [128];
  unsigned_short local_330 [128];
  unsigned_short local_230 [128];
  unsigned_short local_130 [128];
  
  std::ofstream::ofstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            ((ofstream *)&ostream,outfile_path,_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    printf("error: could not open %s for writing\n",(outfile_path->_M_pathname)._M_dataplus._M_p);
  }
  else {
    specfile_data.icon_bitmap_filename._M_dataplus._M_p =
         (pointer)&specfile_data.icon_bitmap_filename.field_2;
    specfile_data.version = 0;
    specfile_data.icon_bitmap_filename._M_string_length = 0;
    specfile_data.icon_bitmap_filename.field_2._M_local_buf[0] = L'\0';
    specfile_data.icon_palette_filename._M_dataplus._M_p =
         (pointer)&specfile_data.icon_palette_filename.field_2;
    specfile_data.icon_palette_filename._M_string_length = 0;
    specfile_data.icon_palette_filename.field_2._M_local_buf[0] = L'\0';
    specfile_data.japanese_title._M_dataplus._M_p = (pointer)&specfile_data.japanese_title.field_2;
    specfile_data.japanese_title._M_string_length = 0;
    specfile_data.japanese_title.field_2._M_local_buf[0] = L'\0';
    specfile_data.english_title._M_dataplus._M_p = (pointer)&specfile_data.english_title.field_2;
    specfile_data.english_title._M_string_length = 0;
    specfile_data.english_title.field_2._M_local_buf[0] = L'\0';
    specfile_data.french_title._M_dataplus._M_p = (pointer)&specfile_data.french_title.field_2;
    specfile_data.french_title._M_string_length = 0;
    specfile_data.french_title.field_2._M_local_buf[0] = L'\0';
    specfile_data.german_title._M_dataplus._M_p = (pointer)&specfile_data.german_title.field_2;
    specfile_data.german_title._M_string_length = 0;
    specfile_data.german_title.field_2._M_local_buf[0] = L'\0';
    specfile_data.italian_title._M_dataplus._M_p = (pointer)&specfile_data.italian_title.field_2;
    specfile_data.italian_title._M_string_length = 0;
    specfile_data.italian_title.field_2._M_local_buf[0] = L'\0';
    specfile_data.spanish_title._M_dataplus._M_p = (pointer)&specfile_data.spanish_title.field_2;
    specfile_data.spanish_title._M_string_length = 0;
    specfile_data.spanish_title.field_2._M_local_buf[0] = L'\0';
    ParseSpecFile((SpecFileData *)local_870,specfile_path);
    SpecFileData::operator=(&specfile_data,(SpecFileData *)local_870);
    SpecFileData::~SpecFileData((SpecFileData *)local_870);
    memset(local_870 + 2,0,0x83e);
    local_870._0_2_ = specfile_data.version;
    std::filesystem::__cxx11::path::path<std::__cxx11::wstring,std::filesystem::__cxx11::path>
              (&local_da0,&specfile_data.icon_bitmap_filename,auto_format);
    GetIconBitmap(&local_c70,&local_da0);
    memcpy(local_870 + 0x20,&local_c70,0x200);
    std::filesystem::__cxx11::path::~path(&local_da0);
    std::filesystem::__cxx11::path::path<std::__cxx11::wstring,std::filesystem::__cxx11::path>
              ((path *)&local_c70,&specfile_data.icon_palette_filename,auto_format);
    GetIconPalette((IconPalette *)&local_da0,(path *)&local_c70);
    local_640 = local_da0._M_pathname.field_2._M_allocated_capacity;
    auStack_638[0] = local_da0._M_pathname.field_2._M_local_buf[8];
    auStack_638[1] = local_da0._M_pathname.field_2._M_local_buf[9];
    auStack_638[2] = local_da0._M_pathname.field_2._M_local_buf[10];
    auStack_638[3] = local_da0._M_pathname.field_2._M_local_buf[0xb];
    auStack_638[4] = local_da0._M_pathname.field_2._M_local_buf[0xc];
    auStack_638[5] = local_da0._M_pathname.field_2._M_local_buf[0xd];
    auStack_638[6] = local_da0._M_pathname.field_2._M_local_buf[0xe];
    auStack_638[7] = local_da0._M_pathname.field_2._M_local_buf[0xf];
    local_870._544_8_ = local_da0._M_pathname._M_dataplus._M_p;
    sStack_648 = local_da0._M_pathname._M_string_length;
    std::filesystem::__cxx11::path::~path((path *)&local_c70);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<char16_t*,unsigned_short*>
              (specfile_data.japanese_title._M_dataplus._M_p,
               specfile_data.japanese_title._M_dataplus._M_p +
               specfile_data.japanese_title._M_string_length,local_630);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<char16_t*,unsigned_short*>
              (specfile_data.english_title._M_dataplus._M_p,
               specfile_data.english_title._M_dataplus._M_p +
               specfile_data.english_title._M_string_length,local_530);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<char16_t*,unsigned_short*>
              (specfile_data.french_title._M_dataplus._M_p,
               specfile_data.french_title._M_dataplus._M_p +
               specfile_data.french_title._M_string_length,local_430);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<char16_t*,unsigned_short*>
              (specfile_data.german_title._M_dataplus._M_p,
               specfile_data.german_title._M_dataplus._M_p +
               specfile_data.german_title._M_string_length,local_330);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<char16_t*,unsigned_short*>
              (specfile_data.italian_title._M_dataplus._M_p,
               specfile_data.italian_title._M_dataplus._M_p +
               specfile_data.italian_title._M_string_length,local_230);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<char16_t*,unsigned_short*>
              (specfile_data.spanish_title._M_dataplus._M_p,
               specfile_data.spanish_title._M_dataplus._M_p +
               specfile_data.spanish_title._M_string_length,local_130);
    local_870._2_2_ = CalculateCRC16FromBannerData(local_870 + 0x20);
    OutputBanner(&ostream,(Banner *)local_870);
    SpecFileData::~SpecFileData(&specfile_data);
  }
  std::ofstream::~ofstream(&ostream);
  return cVar1 != '\0';
}

Assistant:

bool MakeBanner(const std::filesystem::path& specfile_path, const std::filesystem::path& outfile_path) {
    std::ofstream ostream(outfile_path, std::ios::binary);
    if (!ostream.is_open()) {
#ifdef _MSC_VER
        printf("error: could not open %ls for writing\n", outfile_path.c_str());
#else
        printf("error: could not open %s for writing\n", outfile_path.c_str());
#endif
        return false;
    }

    SpecFileData specfile_data = {};
    try {
        specfile_data = ParseSpecFile(specfile_path);
    } catch (std::runtime_error& e) {
        printf("error: %s\n", e.what());
        return false;
    }

    Banner banner = {};

    banner.version = specfile_data.version;
    banner.bitmap = GetIconBitmap(specfile_data.icon_bitmap_filename);
    banner.palette = GetIconPalette(specfile_data.icon_palette_filename);

    std::copy(specfile_data.japanese_title.begin(), specfile_data.japanese_title.end(), banner.japanese_title.data());
    std::copy(specfile_data.english_title.begin(), specfile_data.english_title.end(), banner.english_title.data());
    std::copy(specfile_data.french_title.begin(), specfile_data.french_title.end(), banner.french_title.data());
    std::copy(specfile_data.german_title.begin(), specfile_data.german_title.end(), banner.german_title.data());
    std::copy(specfile_data.italian_title.begin(), specfile_data.italian_title.end(), banner.italian_title.data());
    std::copy(specfile_data.spanish_title.begin(), specfile_data.spanish_title.end(), banner.spanish_title.data());

    // checksum the banner data, starting from the icon bitmap and ending at the end of the file.
    banner.crc = CalculateCRC16FromBannerData(banner.bitmap.data());

    // check against diamond's icon crc
    // if (banner.crc != 0x048B) {
    //     printf("CRC did not match (expected 0x048B, got 0x%04X)\n", banner.crc);
    // } else {
    //     printf("CRC matched\n");
    // }

    OutputBanner(ostream, banner);
    return true;
}